

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_packBytes(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long lVar5;
  CVmDataSource *in_RCX;
  vm_val_t *in_RDX;
  CVmByteArraySource dst;
  long idx;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff48;
  uint *in_stack_ffffffffffffff50;
  vm_val_t *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  vm_obj_id_t arr;
  undefined4 in_stack_ffffffffffffff70;
  int iVar6;
  CVmByteArraySource local_80;
  unsigned_long local_48;
  int local_2c;
  
  arr = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (in_RCX == (CVmDataSource *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int *)&in_RCX->_vptr_CVmDataSource;
  }
  local_2c = iVar6;
  if ((getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_packBytes::desc,2,0,1);
    __cxa_guard_release(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (iVar1 == 0) {
    iVar2 = CVmBif::pop_long_val();
    uVar3 = (unsigned_long)iVar2;
    local_2c = local_2c + -1;
    if ((long)uVar3 < 1) {
      local_48 = 1;
    }
    else {
      local_48 = uVar3;
      uVar4 = get_element_count((CVmObjByteArray *)0x2c4168);
      if (uVar4 < uVar3) {
        local_48 = get_element_count((CVmObjByteArray *)0x2c417f);
      }
      arr = (vm_obj_id_t)(uVar3 >> 0x20);
    }
    local_48 = local_48 - 1;
    CVmByteArraySource::CVmByteArraySource
              ((CVmByteArraySource *)CONCAT44(iVar6,in_stack_ffffffffffffff70),arr);
    CVmByteArraySource::seek(&local_80,local_48,0);
    CVmPack::pack((int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RCX);
    CVmStack::discard(local_2c);
    lVar5 = CVmByteArraySource::get_pos(&local_80);
    vm_val_t::set_int(in_RDX,(int)lVar5 - (int)local_48);
    CVmByteArraySource::~CVmByteArraySource((CVmByteArraySource *)0x2c422b);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_packBytes(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index from the first argument */
    long idx = CVmBif::pop_long_val(vmg0_);
    --argc;

    /* limit the index to 1..length */
    if (idx < 1)
        idx = 1;
    else if ((ulong)idx > get_element_count())
        idx = get_element_count();

    /* adjust to a zero-based index */
    --idx;

    /* set up a data source for the byte array */
    CVmByteArraySource dst(vmg_ self);

    /* seek to the starting index */
    dst.seek(idx, OSFSK_SET);

    /* do the packing */
    CVmPack::pack(vmg_ 0, argc, &dst);

    /* discard the arguments */
    G_stk->discard(argc);

    /* return the number of bytes written */
    retval->set_int(dst.get_pos() - idx);

    /* handled */
    return TRUE;
}